

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCFilterFunctionN p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  NodeRef *pNVar22;
  ulong unaff_R12;
  size_t mask;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [32];
  undefined1 auVar47 [16];
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  ulong local_1500;
  undefined1 local_14c8 [16];
  Geometry *local_14b0;
  ulong local_14a8;
  Scene *local_14a0;
  ulong local_1498;
  ulong local_1490;
  NodeRef *local_1488;
  ulong local_1480;
  RTCFilterFunctionNArguments args;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  byte local_13d7;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar53 = ZEXT3264(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar54 = ZEXT3264(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar55 = ZEXT3264(auVar41);
  auVar26 = vmulss_avx512f(auVar39._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar39._0_4_ = auVar26._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar39._16_4_ = auVar39._0_4_;
  auVar39._20_4_ = auVar39._0_4_;
  auVar39._24_4_ = auVar39._0_4_;
  auVar39._28_4_ = auVar39._0_4_;
  auVar26 = vmulss_avx512f(auVar40._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar40._0_4_ = auVar26._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar40._16_4_ = auVar40._0_4_;
  auVar40._20_4_ = auVar40._0_4_;
  auVar40._24_4_ = auVar40._0_4_;
  auVar40._28_4_ = auVar40._0_4_;
  auVar26 = vmulss_avx512f(auVar41._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar41._0_4_ = auVar26._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar41._16_4_ = auVar41._0_4_;
  auVar41._20_4_ = auVar41._0_4_;
  auVar41._24_4_ = auVar41._0_4_;
  auVar41._28_4_ = auVar41._0_4_;
  local_1490 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1498 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = local_1490 ^ 0x20;
  uVar21 = local_1498 ^ 0x20;
  auVar43._8_4_ = 0x80000000;
  auVar43._0_8_ = 0x8000000080000000;
  auVar43._12_4_ = 0x80000000;
  auVar43._16_4_ = 0x80000000;
  auVar43._20_4_ = 0x80000000;
  auVar43._24_4_ = 0x80000000;
  auVar43._28_4_ = 0x80000000;
  auVar39 = vxorps_avx512vl(auVar39,auVar43);
  auVar56 = ZEXT3264(auVar39);
  auVar39 = vxorps_avx512vl(auVar40,auVar43);
  auVar57 = ZEXT3264(auVar39);
  auVar39 = vxorps_avx512vl(auVar41,auVar43);
  auVar58 = ZEXT3264(auVar39);
  auVar39 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar59 = ZEXT3264(auVar39);
  auVar39 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar60 = ZEXT3264(auVar39);
  auVar26 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar61 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar62 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar63 = ZEXT1664(auVar26);
  auVar26 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar64 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar65 = ZEXT1664(auVar26);
  pNVar22 = stack + 1;
  do {
    local_1488 = pNVar22;
    if (local_1488 == stack) break;
    pNVar22 = local_1488 + -1;
    sVar19 = local_1488[-1].ptr;
    do {
      if ((sVar19 & 8) == 0) {
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar19 + 0x40 + local_1490),auVar56._0_32_,
                             auVar53._0_32_);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar19 + 0x40 + local_1498),auVar57._0_32_,
                             auVar54._0_32_);
        auVar39 = vpmaxsd_avx2(auVar39,auVar40);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar19 + 0x40 + uVar17),auVar58._0_32_,
                             auVar55._0_32_);
        auVar40 = vpmaxsd_avx512vl(auVar40,auVar59._0_32_);
        auVar39 = vpmaxsd_avx2(auVar39,auVar40);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar19 + 0x40 + uVar20),auVar56._0_32_,
                             auVar53._0_32_);
        auVar41 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar19 + 0x40 + uVar21),auVar57._0_32_,
                             auVar54._0_32_);
        auVar40 = vpminsd_avx2(auVar40,auVar41);
        auVar41 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(sVar19 + 0x40 + (uVar17 ^ 0x20)),auVar58._0_32_,
                             auVar55._0_32_);
        auVar41 = vpminsd_avx512vl(auVar41,auVar60._0_32_);
        auVar40 = vpminsd_avx2(auVar40,auVar41);
        uVar14 = vpcmpd_avx512vl(auVar39,auVar40,2);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar14);
      }
      if ((sVar19 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar48 = 4;
        }
        else {
          uVar18 = sVar19 & 0xfffffffffffffff0;
          lVar16 = 0;
          for (uVar15 = unaff_R12; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          for (uVar15 = unaff_R12 - 1 & unaff_R12; sVar19 = *(size_t *)(uVar18 + lVar16 * 8),
              uVar15 != 0; uVar15 = uVar15 - 1 & uVar15) {
            pNVar22->ptr = sVar19;
            pNVar22 = pNVar22 + 1;
            lVar16 = 0;
            for (uVar25 = uVar15; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
          }
          uVar48 = 0;
        }
      }
      else {
        uVar48 = 6;
      }
    } while (uVar48 == 0);
    if (uVar48 == 6) {
      uVar48 = 0;
      local_1480 = (ulong)((uint)sVar19 & 0xf) - 8;
      bVar23 = local_1480 != 0;
      if (bVar23) {
        uVar15 = sVar19 & 0xfffffffffffffff0;
        uVar18 = 0;
        do {
          lVar16 = uVar18 * 0x50;
          local_14a0 = context->scene;
          ppfVar5 = (local_14a0->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar15 + 0x30 + lVar16)];
          pfVar7 = ppfVar5[*(uint *)(uVar15 + 0x34 + lVar16)];
          pfVar8 = ppfVar5[*(uint *)(uVar15 + 0x38 + lVar16)];
          pfVar9 = ppfVar5[*(uint *)(uVar15 + 0x3c + lVar16)];
          auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar15 + lVar16)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar15 + 8 + lVar16)));
          auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar15 + lVar16)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar15 + 8 + lVar16)));
          auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar15 + 4 + lVar16)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar15 + 0xc + lVar16)))
          ;
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar15 + 4 + lVar16)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar15 + 0xc + lVar16)))
          ;
          auVar31 = vunpcklps_avx(auVar26,auVar38);
          auVar29 = vunpcklps_avx(auVar37,auVar47);
          auVar30 = vunpckhps_avx(auVar37,auVar47);
          auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar15 + 0x10 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar15 + 0x18 + lVar16)));
          auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar15 + 0x10 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar15 + 0x18 + lVar16)));
          auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar15 + 0x14 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar15 + 0x1c + lVar16)));
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar15 + 0x14 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar15 + 0x1c + lVar16)));
          auVar35 = vunpcklps_avx(auVar26,auVar38);
          auVar28 = vunpcklps_avx(auVar37,auVar47);
          auVar38 = vunpckhps_avx(auVar37,auVar47);
          auVar47 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar15 + 0x20 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar15 + 0x28 + lVar16)));
          auVar26 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar15 + 0x20 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar15 + 0x28 + lVar16)));
          auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar15 + 0x24 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar15 + 0x2c + lVar16)));
          auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar15 + 0x24 + lVar16))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar15 + 0x2c + lVar16)));
          auVar27 = vunpcklps_avx(auVar26,auVar37);
          auVar32 = vunpcklps_avx(auVar47,auVar36);
          puVar1 = (undefined8 *)(uVar15 + 0x30 + lVar16);
          local_1428 = *puVar1;
          uStack_1420 = puVar1[1];
          auVar36 = vunpckhps_avx(auVar47,auVar36);
          puVar1 = (undefined8 *)(uVar15 + 0x40 + lVar16);
          local_1438 = *puVar1;
          uStack_1430 = puVar1[1];
          auVar26 = vsubps_avx(auVar29,auVar28);
          auVar38 = vsubps_avx(auVar30,auVar38);
          auVar37 = vsubps_avx(auVar31,auVar35);
          auVar47 = vsubps_avx(auVar32,auVar29);
          auVar36 = vsubps_avx(auVar36,auVar30);
          auVar35 = vsubps_avx(auVar27,auVar31);
          auVar27._0_4_ = auVar38._0_4_ * auVar35._0_4_;
          auVar27._4_4_ = auVar38._4_4_ * auVar35._4_4_;
          auVar27._8_4_ = auVar38._8_4_ * auVar35._8_4_;
          auVar27._12_4_ = auVar38._12_4_ * auVar35._12_4_;
          local_1398 = vfmsub231ps_fma(auVar27,auVar36,auVar37);
          auVar32._0_4_ = auVar37._0_4_ * auVar47._0_4_;
          auVar32._4_4_ = auVar37._4_4_ * auVar47._4_4_;
          auVar32._8_4_ = auVar37._8_4_ * auVar47._8_4_;
          auVar32._12_4_ = auVar37._12_4_ * auVar47._12_4_;
          local_1388 = vfmsub231ps_fma(auVar32,auVar35,auVar26);
          auVar33._0_4_ = auVar26._0_4_ * auVar36._0_4_;
          auVar33._4_4_ = auVar26._4_4_ * auVar36._4_4_;
          auVar33._8_4_ = auVar26._8_4_ * auVar36._8_4_;
          auVar33._12_4_ = auVar26._12_4_ * auVar36._12_4_;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar34._4_4_ = uVar2;
          auVar34._0_4_ = uVar2;
          auVar34._8_4_ = uVar2;
          auVar34._12_4_ = uVar2;
          fVar42 = *(float *)(ray + k * 4 + 0x50);
          auVar52._4_4_ = fVar42;
          auVar52._0_4_ = fVar42;
          auVar52._8_4_ = fVar42;
          auVar52._12_4_ = fVar42;
          auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar2 = *(undefined4 *)(ray + k * 4);
          auVar28._4_4_ = uVar2;
          auVar28._0_4_ = uVar2;
          auVar28._8_4_ = uVar2;
          auVar28._12_4_ = uVar2;
          auVar28 = vsubps_avx512vl(auVar29,auVar28);
          local_1378 = vfmsub231ps_fma(auVar33,auVar47,auVar38);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar29._4_4_ = uVar2;
          auVar29._0_4_ = uVar2;
          auVar29._8_4_ = uVar2;
          auVar29._12_4_ = uVar2;
          auVar29 = vsubps_avx512vl(auVar30,auVar29);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar30._4_4_ = uVar2;
          auVar30._0_4_ = uVar2;
          auVar30._8_4_ = uVar2;
          auVar30._12_4_ = uVar2;
          auVar30 = vsubps_avx512vl(auVar31,auVar30);
          auVar31._0_4_ = fVar42 * auVar30._0_4_;
          auVar31._4_4_ = fVar42 * auVar30._4_4_;
          auVar31._8_4_ = fVar42 * auVar30._8_4_;
          auVar31._12_4_ = fVar42 * auVar30._12_4_;
          auVar31 = vfmsub231ps_avx512vl(auVar31,auVar29,auVar27);
          auVar32 = vmulps_avx512vl(auVar27,auVar28);
          auVar32 = vfmsub231ps_avx512vl(auVar32,auVar30,auVar34);
          auVar33 = vmulps_avx512vl(auVar34,auVar29);
          auVar33 = vfmsub231ps_avx512vl(auVar33,auVar28,auVar52);
          auVar27 = vmulps_avx512vl(local_1378,auVar27);
          auVar27 = vfmadd231ps_avx512vl(auVar27,local_1388,auVar52);
          auVar27 = vfmadd231ps_avx512vl(auVar27,local_1398,auVar34);
          local_13e8 = vandps_avx512vl(auVar27,auVar62._0_16_);
          auVar34 = vandps_avx512vl(auVar27,auVar63._0_16_);
          auVar35 = vmulps_avx512vl(auVar35,auVar33);
          auVar36 = vfmadd231ps_avx512vl(auVar35,auVar32,auVar36);
          auVar47 = vfmadd231ps_fma(auVar36,auVar31,auVar47);
          uVar48 = auVar34._0_4_;
          local_1418._0_4_ = (float)(uVar48 ^ auVar47._0_4_);
          uVar49 = auVar34._4_4_;
          local_1418._4_4_ = (float)(uVar49 ^ auVar47._4_4_);
          uVar50 = auVar34._8_4_;
          local_1418._8_4_ = (float)(uVar50 ^ auVar47._8_4_);
          uVar51 = auVar34._12_4_;
          local_1418._12_4_ = (float)(uVar51 ^ auVar47._12_4_);
          auVar37 = vmulps_avx512vl(auVar37,auVar33);
          auVar38 = vfmadd231ps_avx512vl(auVar37,auVar38,auVar32);
          auVar26 = vfmadd231ps_fma(auVar38,auVar26,auVar31);
          local_1408._0_4_ = (float)(uVar48 ^ auVar26._0_4_);
          local_1408._4_4_ = (float)(uVar49 ^ auVar26._4_4_);
          local_1408._8_4_ = (float)(uVar50 ^ auVar26._8_4_);
          local_1408._12_4_ = (float)(uVar51 ^ auVar26._12_4_);
          auVar26 = auVar64._0_16_;
          uVar14 = vcmpps_avx512vl(local_1418,auVar26,5);
          uVar11 = vcmpps_avx512vl(local_1408,auVar26,5);
          uVar12 = vcmpps_avx512vl(auVar27,auVar26,4);
          auVar26._0_4_ = local_1408._0_4_ + local_1418._0_4_;
          auVar26._4_4_ = local_1408._4_4_ + local_1418._4_4_;
          auVar26._8_4_ = local_1408._8_4_ + local_1418._8_4_;
          auVar26._12_4_ = local_1408._12_4_ + local_1418._12_4_;
          uVar13 = vcmpps_avx512vl(auVar26,local_13e8,2);
          local_13d7 = (byte)uVar14 & (byte)uVar11 & (byte)uVar12 & (byte)uVar13;
          if (local_13d7 != 0) {
            auVar47._0_4_ = local_1378._0_4_ * auVar30._0_4_;
            auVar47._4_4_ = local_1378._4_4_ * auVar30._4_4_;
            auVar47._8_4_ = local_1378._8_4_ * auVar30._8_4_;
            auVar47._12_4_ = local_1378._12_4_ * auVar30._12_4_;
            auVar26 = vfmadd213ps_fma(auVar29,local_1388,auVar47);
            auVar26 = vfmadd213ps_fma(auVar28,local_1398,auVar26);
            local_13f8._0_4_ = (float)(uVar48 ^ auVar26._0_4_);
            local_13f8._4_4_ = (float)(uVar49 ^ auVar26._4_4_);
            local_13f8._8_4_ = (float)(uVar50 ^ auVar26._8_4_);
            local_13f8._12_4_ = (float)(uVar51 ^ auVar26._12_4_);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar38._4_4_ = uVar2;
            auVar38._0_4_ = uVar2;
            auVar38._8_4_ = uVar2;
            auVar38._12_4_ = uVar2;
            auVar26 = vmulps_avx512vl(local_13e8,auVar38);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar37._4_4_ = uVar2;
            auVar37._0_4_ = uVar2;
            auVar37._8_4_ = uVar2;
            auVar37._12_4_ = uVar2;
            auVar38 = vmulps_avx512vl(local_13e8,auVar37);
            uVar14 = vcmpps_avx512vl(local_13f8,auVar38,2);
            uVar11 = vcmpps_avx512vl(auVar26,local_13f8,1);
            local_13d7 = (byte)uVar14 & (byte)uVar11 & local_13d7;
            if (local_13d7 != 0) {
              auVar26 = vrcp14ps_avx512vl(local_13e8);
              auVar38 = vfnmadd213ps_avx512vl(local_13e8,auVar26,auVar65._0_16_);
              auVar26 = vfmadd132ps_fma(auVar38,auVar26,auVar26);
              fVar42 = auVar26._0_4_;
              fVar44 = auVar26._4_4_;
              fVar45 = auVar26._8_4_;
              fVar46 = auVar26._12_4_;
              local_13a8[0] = fVar42 * local_13f8._0_4_;
              local_13a8[1] = fVar44 * local_13f8._4_4_;
              local_13a8[2] = fVar45 * local_13f8._8_4_;
              local_13a8[3] = fVar46 * local_13f8._12_4_;
              local_13c8[0] = fVar42 * local_1418._0_4_;
              local_13c8[1] = fVar44 * local_1418._4_4_;
              local_13c8[2] = fVar45 * local_1418._8_4_;
              local_13c8[3] = fVar46 * local_1418._12_4_;
              local_13b8._0_4_ = fVar42 * local_1408._0_4_;
              local_13b8._4_4_ = fVar44 * local_1408._4_4_;
              local_13b8._8_4_ = fVar45 * local_1408._8_4_;
              local_13b8._12_4_ = fVar46 * local_1408._12_4_;
              local_1500 = (ulong)local_13d7;
              do {
                auVar26 = auVar64._0_16_;
                local_14a8 = 0;
                for (uVar25 = local_1500; (uVar25 & 1) == 0;
                    uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                  local_14a8 = local_14a8 + 1;
                }
                local_14b0 = (local_14a0->geometries).items
                             [*(uint *)((long)&local_1428 + local_14a8 * 4)].ptr;
                if ((local_14b0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_1500 = local_1500 ^ 1L << (local_14a8 & 0x3f);
                  bVar24 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (local_14b0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar24 = false;
                }
                else {
                  local_12d8 = vmovdqu64_avx512vl(auVar60._0_32_);
                  local_12b8 = vmovdqu64_avx512vl(auVar59._0_32_);
                  local_1298 = auVar58._0_32_;
                  local_1278 = auVar57._0_32_;
                  local_1258 = auVar56._0_32_;
                  local_1238 = auVar55._0_32_;
                  local_1218 = auVar54._0_32_;
                  local_11f8 = auVar53._0_32_;
                  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar25 = (ulong)(uint)((int)local_14a8 * 4);
                  uVar3 = *(undefined4 *)((long)local_13c8 + uVar25);
                  local_1338._4_4_ = uVar3;
                  local_1338._0_4_ = uVar3;
                  local_1338._8_4_ = uVar3;
                  local_1338._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_13b8 + uVar25);
                  local_1328._4_4_ = uVar3;
                  local_1328._0_4_ = uVar3;
                  local_1328._8_4_ = uVar3;
                  local_1328._12_4_ = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar25);
                  args.context = context->user;
                  local_1308 = vpbroadcastd_avx512vl();
                  uVar3 = *(undefined4 *)((long)&local_1438 + uVar25);
                  local_1318._4_4_ = uVar3;
                  local_1318._0_4_ = uVar3;
                  local_1318._8_4_ = uVar3;
                  local_1318._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_1398 + uVar25);
                  uVar4 = *(undefined4 *)(local_1388 + uVar25);
                  local_1358._4_4_ = uVar4;
                  local_1358._0_4_ = uVar4;
                  local_1358._8_4_ = uVar4;
                  local_1358._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_1378 + uVar25);
                  local_1348._4_4_ = uVar4;
                  local_1348._0_4_ = uVar4;
                  local_1348._8_4_ = uVar4;
                  local_1348._12_4_ = uVar4;
                  local_1368[0] = (RTCHitN)(char)uVar3;
                  local_1368[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1368[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1368[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_1368[4] = (RTCHitN)(char)uVar3;
                  local_1368[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1368[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1368[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_1368[8] = (RTCHitN)(char)uVar3;
                  local_1368[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1368[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1368[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_1368[0xc] = (RTCHitN)(char)uVar3;
                  local_1368[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1368[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1368[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                  uStack_12f4 = (args.context)->instID[0];
                  local_12f8 = uStack_12f4;
                  uStack_12f0 = uStack_12f4;
                  uStack_12ec = uStack_12f4;
                  uStack_12e8 = (args.context)->instPrimID[0];
                  uStack_12e4 = uStack_12e8;
                  uStack_12e0 = uStack_12e8;
                  uStack_12dc = uStack_12e8;
                  auVar38 = vmovdqa64_avx512vl(auVar61._0_16_);
                  local_14c8 = vmovdqa64_avx512vl(auVar61._0_16_);
                  args.valid = (int *)local_14c8;
                  args.geometryUserPtr = local_14b0->userPtr;
                  args.hit = local_1368;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (local_14b0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_14b0->occlusionFilterN)(&args);
                  }
                  uVar25 = vptestmd_avx512vl(local_14c8,local_14c8);
                  if ((uVar25 & 0xf) == 0) {
                    bVar24 = true;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_14b0->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                    }
                    uVar25 = vptestmd_avx512vl(local_14c8,local_14c8);
                    uVar25 = uVar25 & 0xf;
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar24 = (bool)((byte)uVar25 & 1);
                    auVar36._0_4_ =
                         (uint)bVar24 * auVar37._0_4_ | (uint)!bVar24 * *(int *)(args.ray + 0x80);
                    bVar24 = (bool)((byte)(uVar25 >> 1) & 1);
                    auVar36._4_4_ =
                         (uint)bVar24 * auVar37._4_4_ | (uint)!bVar24 * *(int *)(args.ray + 0x84);
                    bVar24 = (bool)((byte)(uVar25 >> 2) & 1);
                    auVar36._8_4_ =
                         (uint)bVar24 * auVar37._8_4_ | (uint)!bVar24 * *(int *)(args.ray + 0x88);
                    bVar24 = SUB81(uVar25 >> 3,0);
                    auVar36._12_4_ =
                         (uint)bVar24 * auVar37._12_4_ | (uint)!bVar24 * *(int *)(args.ray + 0x8c);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                    bVar24 = (byte)uVar25 == 0;
                  }
                  if (bVar24) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar2;
                    local_1500 = local_1500 ^ 1L << (local_14a8 & 0x3f);
                  }
                  auVar53 = ZEXT3264(local_11f8);
                  auVar54 = ZEXT3264(local_1218);
                  auVar55 = ZEXT3264(local_1238);
                  auVar56 = ZEXT3264(local_1258);
                  auVar57 = ZEXT3264(local_1278);
                  auVar58 = ZEXT3264(local_1298);
                  auVar39 = vmovdqu64_avx512vl(local_12b8);
                  auVar59 = ZEXT3264(auVar39);
                  auVar39 = vmovdqu64_avx512vl(local_12d8);
                  auVar60 = ZEXT3264(auVar39);
                  auVar38 = vmovdqa64_avx512vl(auVar38);
                  auVar61 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar62 = ZEXT1664(auVar38);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar63 = ZEXT1664(auVar38);
                  auVar26 = vxorps_avx512vl(auVar26,auVar26);
                  auVar64 = ZEXT1664(auVar26);
                  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar65 = ZEXT1664(auVar26);
                }
                if (!bVar24) {
                  uVar48 = 0;
                  if (bVar23) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar48 = 1;
                  }
                  goto LAB_008355f7;
                }
              } while (local_1500 != 0);
            }
          }
          uVar18 = uVar18 + 1;
          bVar23 = uVar18 < local_1480;
        } while (uVar18 != local_1480);
        uVar48 = 0;
      }
    }
LAB_008355f7:
  } while ((uVar48 & 3) == 0);
  return local_1488 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }